

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::cxx::FieldConstantName_abi_cxx11_
          (string *__return_storage_ptr__,cxx *this,FieldDescriptor *field)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  long lVar3;
  long *plVar4;
  FieldDescriptor *pFVar5;
  size_type *psVar6;
  int i;
  ulong uVar7;
  string field_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  plVar4 = *(long **)this;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  if (plVar4[1] != 0) {
    uVar7 = 0;
    do {
      bVar2 = *(byte *)(*plVar4 + uVar7);
      if ((char)bVar2 < 'a') {
        if ((char)bVar2 < 'A') {
          if ((byte)(bVar2 - 0x30) < 10) {
            std::__cxx11::string::push_back((char)&local_70);
          }
        }
        else if (bVar2 < 0x5b) goto LAB_001bb611;
      }
      else if (bVar2 < 0x7b) {
LAB_001bb611:
        std::__cxx11::string::push_back((char)&local_70);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)plVar4[1]);
  }
  std::operator+(&local_90,"k",&local_70);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    lVar3 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  paVar1 = &local_90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((this[0x34] == (cxx)0x0) &&
     (pFVar5 = Descriptor::FindFieldByCamelcaseName
                         (*(Descriptor **)(this + 0x38),*(string **)(this + 0x18)),
     pFVar5 != (FieldDescriptor *)this)) {
    SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)*(uint *)(this + 0x28),i);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x240cd9);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_90.field_2._M_allocated_capacity = *psVar6;
      local_90.field_2._8_8_ = plVar4[3];
      local_90._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar6;
      local_90._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_90._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string FieldConstantName(const FieldDescriptor *field) {
  string field_name = UnderscoresToCamelCase(field->name(), true);
  string result = "k" + field_name + "FieldNumber";

  if (!field->is_extension() &&
      field->containing_type()->FindFieldByCamelcaseName(
        field->camelcase_name()) != field) {
    // This field's camelcase name is not unique.  As a hack, add the field
    // number to the constant name.  This makes the constant rather useless,
    // but what can we do?
    result += "_" + SimpleItoa(field->number());
  }

  return result;
}